

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,ArrayElementRef *s)

{
  if ((s->object).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])();
    if ((s->startIndex).object != (Expression *)0x0) {
      (*this->_vptr_ASTVisitor[3])(this);
      if ((s->endIndex).object != (Expression *)0x0) {
        (*this->_vptr_ASTVisitor[3])(this);
        return;
      }
      return;
    }
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

virtual void visit (AST::ArrayElementRef& s)
    {
        visitObject (*s.object);
        visitObject (*s.startIndex);
        visitObjectIfNotNull (s.endIndex);
    }